

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::CloneFrom
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  uint i;
  size_t sVar8;
  
  Clear(this,allocator);
  if (4 < (this->rep).compact.countPlusOne - 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x3a6,"(IsCompact())","IsCompact()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pCVar1 = (other->rep).full.root;
  if ((undefined1 *)((long)&pCVar1[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
    uVar4 = GetCompactLength(other);
    (this->rep).full.root = (CharSetNode *)((ulong)uVar4 + 1);
    uVar4 = 0;
    while( true ) {
      uVar5 = GetCompactLength(other);
      if (uVar5 <= uVar4) break;
      uVar5 = GetCompactCharU(other,uVar4);
      ReplaceCompactCharU(this,uVar4,uVar5);
      uVar4 = uVar4 + 1;
    }
    return;
  }
  if (pCVar1 == (CharSetNode *)0x0) {
    sVar8 = 0;
  }
  else {
    iVar6 = (*pCVar1->_vptr_CharSetNode[1])(pCVar1,allocator);
    sVar8 = CONCAT44(extraout_var,iVar6);
  }
  (this->rep).compact.countPlusOne = sVar8;
  CharBitvec::CloneFrom(&(this->rep).full.direct,&(other->rep).full.direct);
  return;
}

Assistant:

void CharSet<char16>::CloneFrom(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        Clear(allocator);
        Assert(IsCompact());
        if (other.IsCompact())
        {
            this->SetCompactLength(other.GetCompactLength());
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                this->ReplaceCompactCharU(i, other.GetCompactCharU(i));
            }
        }
        else
        {
            rep.full.root = other.rep.full.root == nullptr ? nullptr : other.rep.full.root->Clone(allocator);
            rep.full.direct.CloneFrom(other.rep.full.direct);
        }
    }